

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall embree::SubdivMesh::initializeHalfEdgeStructures(SubdivMesh *this)

{
  mvector<uint32_t> *pmVar1;
  char *ptr;
  size_t sVar2;
  uint *puVar3;
  MemoryMonitorInterface *pMVar4;
  pointer pvVar5;
  RawBufferView *pRVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  size_t i;
  char *pcVar11;
  uint *puVar12;
  long lVar13;
  BufferView<embree::Vec3fa> *pBVar14;
  ostream *poVar15;
  runtime_error *prVar16;
  size_t i_2;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  size_t i_6;
  size_t i_5;
  ulong uVar20;
  ulong uVar21;
  Topology *t;
  unsigned_long last;
  Topology *this_00;
  long lVar22;
  undefined1 local_335 [13];
  size_t taskCount;
  unsigned_long local_320;
  ulong local_318;
  BufferView<unsigned_int> *local_310;
  double local_308;
  anon_class_8_1_898bcfc2_conflict23 local_300;
  anon_class_32_4_2dac733d_conflict local_2f8;
  anon_class_40_5_11684cf9_conflict6 local_2d8;
  task_group_context context;
  ParallelPrefixSumState<int> state;
  
  local_308 = getSeconds();
  sVar17 = (this->faceVertices).super_RawBufferView.num;
  uVar20 = (this->super_Geometry).numTimeSteps * sVar17;
  uVar18 = (this->invalid_face).size_alloced;
  uVar19 = uVar18;
  if ((uVar18 < uVar20) && (uVar21 = uVar18, uVar19 = uVar20, uVar18 != 0)) {
    for (; uVar19 = uVar21, uVar21 < uVar20; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  if (uVar20 < (this->invalid_face).size_active) {
    (this->invalid_face).size_active = uVar20;
  }
  if (uVar18 == uVar19) {
    (this->invalid_face).size_active = uVar20;
  }
  else {
    ptr = (this->invalid_face).items;
    if ((uVar19 == 0) ||
       (pMVar4 = (this->invalid_face).alloc.device,
       (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar19,0), uVar19 < 0x1c00000)) {
      pcVar11 = (char *)alignedMalloc(uVar19,1);
    }
    else {
      pcVar11 = (char *)os_malloc(uVar19,&(this->invalid_face).alloc.hugepages);
    }
    (this->invalid_face).items = pcVar11;
    for (uVar18 = 0; uVar18 < (this->invalid_face).size_active; uVar18 = uVar18 + 1) {
      (this->invalid_face).items[uVar18] = ptr[uVar18];
    }
    uVar18 = (this->invalid_face).size_alloced;
    if (ptr == (char *)0x0) {
LAB_005ae778:
      if (uVar18 != 0) goto LAB_005ae77d;
    }
    else {
      if (uVar18 < 0x1c00000) {
        alignedFree(ptr);
        goto LAB_005ae778;
      }
      os_free(ptr,uVar18,(this->invalid_face).alloc.hugepages);
LAB_005ae77d:
      pMVar4 = (this->invalid_face).alloc.device;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,-uVar18,1);
    }
    (this->invalid_face).size_active = uVar20;
    (this->invalid_face).size_alloced = uVar19;
    sVar17 = (this->faceVertices).super_RawBufferView.num;
  }
  uVar18 = (this->faceStartEdge).size_alloced;
  uVar19 = uVar18;
  if ((uVar18 < sVar17) && (uVar20 = uVar18, uVar19 = sVar17, uVar18 != 0)) {
    for (; uVar19 = uVar20, uVar20 < sVar17; uVar20 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0)) {
    }
  }
  if (sVar17 < (this->faceStartEdge).size_active) {
    (this->faceStartEdge).size_active = sVar17;
  }
  pmVar1 = &this->faceStartEdge;
  if (uVar18 == uVar19) {
    (this->faceStartEdge).size_active = sVar17;
  }
  else {
    puVar3 = (this->faceStartEdge).items;
    if (uVar19 == 0) {
      uVar18 = 0;
LAB_005ae837:
      puVar12 = (uint *)alignedMalloc(uVar18,4);
    }
    else {
      pMVar4 = (pmVar1->alloc).device;
      uVar18 = uVar19 * 4;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar18,0);
      if (uVar18 < 0x1c00000) goto LAB_005ae837;
      puVar12 = (uint *)os_malloc(uVar18,&(this->faceStartEdge).alloc.hugepages);
    }
    (this->faceStartEdge).items = puVar12;
    for (uVar18 = 0; uVar18 < (this->faceStartEdge).size_active; uVar18 = uVar18 + 1) {
      (this->faceStartEdge).items[uVar18] = puVar3[uVar18];
    }
    sVar2 = (this->faceStartEdge).size_alloced;
    if (puVar3 != (uint *)0x0) {
      if (sVar2 * 4 < 0x1c00000) {
        alignedFree(puVar3);
      }
      else {
        os_free(puVar3,sVar2 * 4,(this->faceStartEdge).alloc.hugepages);
      }
    }
    if (sVar2 != 0) {
      pMVar4 = (pmVar1->alloc).device;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar2 * -4,1);
    }
    (this->faceStartEdge).size_active = sVar17;
    (this->faceStartEdge).size_alloced = uVar19;
  }
  if ((this->faceVertices).super_RawBufferView.modified != true) goto LAB_005aec9a;
  uVar18 = (this->faceVertices).super_RawBufferView.num;
  local_335._1_4_ = 0;
  if (uVar18 < 0x1000) {
    uVar9 = 0;
    for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
      (this->faceStartEdge).items[uVar19] = uVar9;
      uVar9 = uVar9 + *(int *)((this->faceVertices).super_RawBufferView.ptr_ofs +
                              uVar19 * (this->faceVertices).super_RawBufferView.stride);
    }
  }
  else {
    local_310 = &this->faceVertices;
    local_2f8.identity = (int *)(local_335 + 1);
    local_2f8.dst =
         (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
         local_335;
    local_320 = 0;
    local_335._5_8_ = pmVar1;
    local_318 = uVar18;
    local_2f8.add = (plus<unsigned_int> *)local_310;
    iVar10 = tbb::detail::d1::max_concurrency();
    uVar19 = (local_318 - local_320) + 0x3ff >> 10;
    if ((ulong)(long)iVar10 < uVar19) {
      uVar19 = (long)iVar10;
    }
    if (0x3f < uVar19) {
      uVar19 = 0x40;
    }
    local_2d8.taskCount = &taskCount;
    local_2d8.state = &state;
    taskCount = uVar19;
    local_2d8.first = &local_320;
    local_2d8.last = &local_318;
    local_2d8.func = &local_2f8;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_300.func = &local_2d8;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_for_h:32:43)>
              (0,uVar19,1,(anon_class_8_1_898bcfc2_conflict22 *)&local_300,&context);
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar7 != '\0') {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar16,"task cancelled");
      __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    uVar9 = local_335._1_4_;
    for (sVar17 = 0; taskCount != sVar17; sVar17 = sVar17 + 1) {
      state.sums[sVar17] = uVar9;
      uVar9 = uVar9 + state.counts[sVar17];
    }
    local_2f8.identity = (int *)(local_335 + 1);
    local_2f8.dst =
         (vector_t<unsigned_int,_embree::aligned_monitored_allocator<unsigned_int,_4UL>_> *)
         local_335._5_8_;
    local_2f8.add = (plus<unsigned_int> *)local_335;
    local_2f8.src = local_310;
    local_320 = 0;
    local_318 = uVar18;
    iVar10 = tbb::detail::d1::max_concurrency();
    uVar18 = (local_318 - local_320) + 0x3ff >> 10;
    if ((ulong)(long)iVar10 < uVar18) {
      uVar18 = (long)iVar10;
    }
    last = 0x40;
    if (uVar18 < 0x40) {
      last = uVar18;
    }
    local_2d8.first = &local_320;
    local_2d8.taskCount = &taskCount;
    local_2d8.state = &state;
    local_2d8.func = &local_2f8;
    taskCount = last;
    local_2d8.last = &local_318;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_300.func = &local_2d8;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_for_h:32:43)>
              (0,last,1,&local_300,&context);
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar7 != '\0') {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar16,"task cancelled");
      __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    uVar9 = local_335._1_4_;
    for (sVar17 = 0; taskCount != sVar17; sVar17 = sVar17 + 1) {
      state.sums[sVar17] = uVar9;
      uVar9 = uVar9 + state.counts[sVar17];
    }
  }
  uVar20 = (ulong)(int)uVar9;
  this->numHalfEdges = uVar20;
  uVar18 = (this->halfEdgeFace).size_alloced;
  uVar19 = uVar18;
  if ((uVar18 < uVar20) && (uVar21 = uVar18, uVar19 = uVar20, uVar18 != 0)) {
    for (; uVar19 = uVar21, uVar21 < uVar20; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  if (uVar20 < (this->halfEdgeFace).size_active) {
    (this->halfEdgeFace).size_active = uVar20;
  }
  if (uVar18 == uVar19) {
    (this->halfEdgeFace).size_active = uVar20;
  }
  else {
    puVar3 = (this->halfEdgeFace).items;
    if (uVar19 == 0) {
      uVar18 = 0;
LAB_005aebc5:
      puVar12 = (uint *)alignedMalloc(uVar18,4);
    }
    else {
      pMVar4 = (this->halfEdgeFace).alloc.device;
      uVar18 = uVar19 * 4;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar18,0);
      if (uVar18 < 0x1c00000) goto LAB_005aebc5;
      puVar12 = (uint *)os_malloc(uVar18,&(this->halfEdgeFace).alloc.hugepages);
    }
    (this->halfEdgeFace).items = puVar12;
    for (uVar18 = 0; uVar18 < (this->halfEdgeFace).size_active; uVar18 = uVar18 + 1) {
      (this->halfEdgeFace).items[uVar18] = puVar3[uVar18];
    }
    sVar17 = (this->halfEdgeFace).size_alloced;
    if (puVar3 != (uint *)0x0) {
      if (sVar17 * 4 < 0x1c00000) {
        alignedFree(puVar3);
      }
      else {
        os_free(puVar3,sVar17 * 4,(this->halfEdgeFace).alloc.hugepages);
      }
    }
    if (sVar17 != 0) {
      pMVar4 = (this->halfEdgeFace).alloc.device;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar17 * -4,1);
    }
    (this->halfEdgeFace).size_active = uVar20;
    (this->halfEdgeFace).size_alloced = uVar19;
  }
  lVar13 = 0;
  for (uVar18 = 0; uVar18 < (this->faceVertices).super_RawBufferView.num; uVar18 = uVar18 + 1) {
    for (uVar19 = 0;
        uVar19 < *(uint *)((this->faceVertices).super_RawBufferView.ptr_ofs +
                          (this->faceVertices).super_RawBufferView.stride * uVar18);
        uVar19 = uVar19 + 1) {
      (this->halfEdgeFace).items[lVar13 + uVar19] = (uint)uVar18;
    }
    lVar13 = lVar13 + uVar19;
  }
LAB_005aec9a:
  if (((this->vertex_creases).super_RawBufferView.modified != false) ||
     ((this->vertex_crease_weights).super_RawBufferView.modified == true)) {
    parallel_map<unsigned_int,float>::
    init<embree::BufferView<unsigned_int>,embree::BufferView<float>>
              ((parallel_map<unsigned_int,float> *)
               (this->vertexCreaseMap)._M_t.
               super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>
               .super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl,
               &this->vertex_creases,&this->vertex_crease_weights);
  }
  if (((this->edge_creases).super_RawBufferView.modified != false) ||
     ((this->edge_crease_weights).super_RawBufferView.modified == true)) {
    parallel_map<unsigned_long,float>::
    init<embree::BufferView<embree::HalfEdge::Edge>,embree::BufferView<float>>
              ((parallel_map<unsigned_long,float> *)
               (this->edgeCreaseMap)._M_t.
               super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>
               .super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl,
               &this->edge_creases,&this->edge_crease_weights);
  }
  if ((this->holes).super_RawBufferView.modified == true) {
    parallel_set<unsigned_int>::init<embree::BufferView<unsigned_int>>
              (&((this->holeSet)._M_t.
                 super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>._M_t.
                 super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
                 super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl)->holeSet,&this->holes
              );
  }
  this_00 = (this->topology).items;
  for (lVar13 = (this->topology).size_active * 0xa0; lVar13 != 0; lVar13 = lVar13 + -0xa0) {
    Topology::initializeHalfEdgeStructures(this_00);
    this_00 = this_00 + 1;
  }
  lVar13 = 0x10;
  lVar22 = 0;
  for (uVar18 = 0;
      pvVar5 = (this->vertex_buffer_tags).
               super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar18 < (ulong)(((long)(this->vertex_buffer_tags).
                              super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18);
      uVar18 = uVar18 + 1) {
    std::
    vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
    ::resize((vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
              *)((long)&(pvVar5->
                        super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar22),
             ((ulong)*(uint *)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs +
                              lVar13) + 0xf >> 4) * (this->faceVertices).super_RawBufferView.num);
    lVar13 = lVar13 + 0x38;
    lVar22 = lVar22 + 0x18;
  }
  lVar13 = 0x10;
  lVar22 = 0;
  for (uVar18 = 0; uVar18 < (this->vertexAttribs).size_active; uVar18 = uVar18 + 1) {
    pRVar6 = (this->vertexAttribs).items;
    if (*(long *)((long)pRVar6 + lVar13 + -0x10) != 0) {
      std::
      vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
      ::resize((vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                *)((long)&(((this->vertex_attrib_buffer_tags).
                            super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar22),
               ((ulong)*(uint *)((long)&pRVar6->ptr_ofs + lVar13) + 0xf >> 4) *
               (this->faceVertices).super_RawBufferView.num);
    }
    lVar22 = lVar22 + 0x18;
    lVar13 = lVar13 + 0x38;
  }
  (this->faceVertices).super_RawBufferView.modified = false;
  (this->holes).super_RawBufferView.modified = false;
  pBVar14 = (this->vertices).items;
  for (lVar13 = (this->vertices).size_active * 0x38; lVar13 != 0; lVar13 = lVar13 + -0x38) {
    (pBVar14->super_RawBufferView).modified = false;
    pBVar14 = pBVar14 + 1;
  }
  (this->levels).super_RawBufferView.modified = false;
  (this->edge_creases).super_RawBufferView.modified = false;
  (this->edge_crease_weights).super_RawBufferView.modified = false;
  (this->vertex_creases).super_RawBufferView.modified = false;
  (this->vertex_crease_weights).super_RawBufferView.modified = false;
  local_335._5_8_ = getSeconds();
  bVar8 = State::verbosity(&((this->super_Geometry).device)->super_State,2);
  if (bVar8) {
    std::operator<<((ostream *)&std::cout,"half edge generation = ");
    local_335._5_8_ = (double)local_335._5_8_ - local_308;
    poVar15 = std::ostream::_M_insert<double>((double)local_335._5_8_ * 1000.0);
    std::operator<<(poVar15,"ms, ");
    poVar15 = std::ostream::_M_insert<double>
                        (((((double)CONCAT44(0x45300000,(int)(this->numHalfEdges >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)this->numHalfEdges) - 4503599627370496.0
                          )) * 1e-06) / (double)local_335._5_8_);
    poVar15 = std::operator<<(poVar15,"M/s");
    std::endl<char,std::char_traits<char>>(poVar15);
    printStatistics(this);
  }
  return;
}

Assistant:

void SubdivMesh::initializeHalfEdgeStructures ()
  {
    double t0 = getSeconds();

    invalid_face.resize(numFaces()*numTimeSteps);
 
    /* calculate start edge of each face */
    faceStartEdge.resize(numFaces());
    
    if (faceVertices.isLocalModified())
    {
      numHalfEdges = parallel_prefix_sum(faceVertices,faceStartEdge,numFaces(),0,std::plus<unsigned>());

      /* calculate face of each half edge */
      halfEdgeFace.resize(numHalfEdges);
      for (size_t f=0, h=0; f<numFaces(); f++)
        for (size_t e=0; e<faceVertices[f]; e++)
          halfEdgeFace[h++] = (unsigned int) f;
    }
    
    /* create set with all vertex creases */
    if (vertex_creases.isLocalModified() || vertex_crease_weights.isLocalModified())
      vertexCreaseMap->vertexCreaseMap.init(vertex_creases,vertex_crease_weights);
    
    /* create map with all edge creases */
    if (edge_creases.isLocalModified() || edge_crease_weights.isLocalModified())
      edgeCreaseMap->edgeCreaseMap.init(edge_creases,edge_crease_weights);

    /* create set with all holes */
    if (holes.isLocalModified())
      holeSet->holeSet.init(holes);

    /* create topology */
    for (auto& t: topology)
      t.initializeHalfEdgeStructures();

    /* create interpolation cache mapping for interpolatable meshes */
    for (size_t i=0; i<vertex_buffer_tags.size(); i++)
      vertex_buffer_tags[i].resize(numFaces()*numInterpolationSlots4(vertices[i].getStride()));
    for (size_t i=0; i<vertexAttribs.size(); i++)
      if (vertexAttribs[i]) vertex_attrib_buffer_tags[i].resize(numFaces()*numInterpolationSlots4(vertexAttribs[i].getStride()));

    /* cleanup some state for static scenes */
    /* if (scene_ == nullptr || scene_->isStaticAccel()) 
    {
      vertexCreaseMap->vertexCreaseMap.clear();
      edgeCreaseMap->edgeCreaseMap.clear();
    } */

    /* clear modified state of all buffers */
    faceVertices.clearLocalModified();
    holes.clearLocalModified();
    for (auto& buffer : vertices) buffer.clearLocalModified(); 
    levels.clearLocalModified();
    edge_creases.clearLocalModified();
    edge_crease_weights.clearLocalModified();
    vertex_creases.clearLocalModified();
    vertex_crease_weights.clearLocalModified();

    double t1 = getSeconds();

    /* print statistics in verbose mode */
    if (device->verbosity(2)) {
      std::cout << "half edge generation = " << 1000.0*(t1-t0) << "ms, " << 1E-6*double(numHalfEdges)/(t1-t0) << "M/s" << std::endl;
      printStatistics();
    }
  }